

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_5_is_does_list(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_DOES,G->val[-2]);
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_LIST,pPVar1);
  G->val[-2] = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_5_is_does_list(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define a G->val[-2]
  yyprintf((stderr, "do yy_5_is_does_list"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {a=PVIP_node_new_children1(&(G->data), PVIP_NODE_LIST, PVIP_node_new_children1(&(G->data), PVIP_NODE_DOES, a)); }\n"));
  a=PVIP_node_new_children1(&(G->data), PVIP_NODE_LIST, PVIP_node_new_children1(&(G->data), PVIP_NODE_DOES, a)); ;
#undef b
#undef a
}